

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

_Bool msgpack_unpacker_init(msgpack_unpacker *mpac,size_t initial_buffer_size)

{
  char *__ptr;
  undefined8 *__ptr_00;
  msgpack_zone *pmVar1;
  
  if (initial_buffer_size < 5) {
    initial_buffer_size = 4;
  }
  __ptr = (char *)malloc(initial_buffer_size);
  if (__ptr != (char *)0x0) {
    __ptr_00 = (undefined8 *)malloc(0x820);
    if (__ptr_00 != (undefined8 *)0x0) {
      pmVar1 = msgpack_zone_new(0x2000);
      if (pmVar1 != (msgpack_zone *)0x0) {
        mpac->buffer = __ptr;
        mpac->used = 4;
        mpac->free = initial_buffer_size - 4;
        mpac->off = 4;
        mpac->parsed = 0;
        mpac->initial_buffer_size = initial_buffer_size;
        mpac->z = pmVar1;
        mpac->ctx = __ptr_00;
        __ptr[0] = '\x01';
        __ptr[1] = '\0';
        __ptr[2] = '\0';
        __ptr[3] = '\0';
        __ptr_00[2] = 0;
        *(undefined4 *)(__ptr_00 + 3) = 0;
        *(undefined4 *)(__ptr_00 + 4) = 0;
        *__ptr_00 = pmVar1;
        *(undefined1 *)(__ptr_00 + 1) = 0;
        return true;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return false;
}

Assistant:

bool msgpack_unpacker_init(msgpack_unpacker* mpac, size_t initial_buffer_size)
{
    char* buffer;
    void* ctx;
    msgpack_zone* z;

    if(initial_buffer_size < COUNTER_SIZE) {
        initial_buffer_size = COUNTER_SIZE;
    }

    buffer = (char*)malloc(initial_buffer_size);
    if(buffer == NULL) {
        return false;
    }

    ctx = malloc(sizeof(template_context));
    if(ctx == NULL) {
        free(buffer);
        return false;
    }

    z = msgpack_zone_new(MSGPACK_ZONE_CHUNK_SIZE);
    if(z == NULL) {
        free(ctx);
        free(buffer);
        return false;
    }

    mpac->buffer = buffer;
    mpac->used = COUNTER_SIZE;
    mpac->free = initial_buffer_size - mpac->used;
    mpac->off = COUNTER_SIZE;
    mpac->parsed = 0;
    mpac->initial_buffer_size = initial_buffer_size;
    mpac->z = z;
    mpac->ctx = ctx;

    init_count(mpac->buffer);

    template_init(CTX_CAST(mpac->ctx));
    CTX_CAST(mpac->ctx)->user.z = mpac->z;
    CTX_CAST(mpac->ctx)->user.referenced = false;

    return true;
}